

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O3

void vkt::sparse::submitCommandsAndWait
               (DeviceInterface *vk,VkDevice device,VkQueue queue,VkCommandBuffer commandBuffer,
               deUint32 waitSemaphoreCount,VkSemaphore *pWaitSemaphores,
               VkPipelineStageFlags *pWaitDstStageMask,deUint32 signalSemaphoreCount,
               VkSemaphore *pSignalSemaphores)

{
  VkFence obj;
  undefined4 uVar1;
  VkResult VVar2;
  VkFenceCreateInfo fenceParams;
  VkSubmitInfo submitInfo;
  VkCommandBuffer local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_b0;
  VkFenceCreateInfo local_98;
  Move<vk::Handle<(vk::HandleType)6>_> local_78;
  VkPipelineStageFlags *local_58;
  undefined4 local_50;
  VkCommandBuffer *local_48;
  deUint32 local_40;
  VkSemaphore *local_38;
  
  local_98.flags = 0;
  local_98._20_4_ = 0;
  local_98.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.pNext = (void *)0x0;
  local_c0 = commandBuffer;
  ::vk::createFence(&local_78,vk,device,&local_98,(VkAllocationCallbacks *)0x0);
  uVar1 = (undefined4)
          local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  DStack_b0.m_device._0_4_ =
       (deUint32)local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device;
  DStack_b0.m_device._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device._4_4_;
  DStack_b0.m_allocator._0_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._0_4_;
  DStack_b0.m_allocator._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_;
  local_b8 = (undefined4)
             local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  uStack_b4 = local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal._4_4_;
  DStack_b0.m_deviceIface._0_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_b0.m_deviceIface._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface._4_4_;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal._0_4_ = 4;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_58 = pWaitDstStageMask;
  local_50 = 1;
  local_48 = &local_c0;
  local_40 = signalSemaphoreCount;
  local_38 = pSignalSemaphores;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device._0_4_ =
       waitSemaphoreCount;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pWaitSemaphores;
  VVar2 = (*vk->_vptr_DeviceInterface[2])
                    (vk,queue,1,&local_78,
                     CONCAT44(local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                              m_internal._4_4_,uVar1));
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesTestsUtil.cpp"
                    ,0x231);
  VVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_b8,1,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesTestsUtil.cpp"
                    ,0x232);
  obj.m_internal._4_4_ = uStack_b4;
  obj.m_internal._0_4_ = local_b8;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_b0,obj);
  }
  return;
}

Assistant:

void submitCommandsAndWait (const DeviceInterface&		vk,
							const VkDevice				device,
							const VkQueue				queue,
							const VkCommandBuffer		commandBuffer,
							const deUint32				waitSemaphoreCount,
							const VkSemaphore*			pWaitSemaphores,
							const VkPipelineStageFlags*	pWaitDstStageMask,
							const deUint32				signalSemaphoreCount,
							const VkSemaphore*			pSignalSemaphores)
{
	const VkFenceCreateInfo	fenceParams =
	{
		VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,								// const void*			pNext;
		0u,										// VkFenceCreateFlags	flags;
	};
	const Unique<VkFence> fence(createFence(vk, device, &fenceParams));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType				sType;
		DE_NULL,							// const void*					pNext;
		waitSemaphoreCount,					// deUint32						waitSemaphoreCount;
		pWaitSemaphores,					// const VkSemaphore*			pWaitSemaphores;
		pWaitDstStageMask,					// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,									// deUint32						commandBufferCount;
		&commandBuffer,						// const VkCommandBuffer*		pCommandBuffers;
		signalSemaphoreCount,				// deUint32						signalSemaphoreCount;
		pSignalSemaphores,					// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));
}